

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O1

int MRIStepSetOrder(void *arkode_mem,int ord)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  sunindextype Tliw;
  sunindextype Tlrw;
  ARKodeMRIStepMem local_30;
  ARKodeMem local_28;
  int local_20;
  int local_1c;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"MRIStepSetOrder",&local_28,&local_30);
  if (iVar1 == 0) {
    iVar1 = 3;
    if (0xfffffffd < ord - 5U) {
      iVar1 = ord;
    }
    local_30->q = iVar1;
    iVar1 = 0;
    local_30->p = 0;
    local_30->stages = 0;
    MRIStepCoupling_Space(local_30->MRIC,&local_20,&local_1c);
    MRIStepCoupling_Free(local_30->MRIC);
    local_30->MRIC = (MRIStepCoupling)0x0;
    local_28->liw = local_28->liw - (long)local_20;
    local_28->lrw = local_28->lrw - (long)local_1c;
  }
  return iVar1;
}

Assistant:

int MRIStepSetOrder(void *arkode_mem, int ord)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  sunindextype Tlrw, Tliw;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepSetOrder",
                                 &ark_mem, &step_mem);
  if (retval) return(retval);

  /* check for illegal inputs */
  if (ord < 3 || ord > 4) {
    step_mem->q = 3;
  } else {
    step_mem->q = ord;
  }

  /* Clear tables, the user is requesting a change in method or a reset to
     defaults. Tables will be set in InitialSetup. */
  step_mem->stages = 0;
  step_mem->p = 0;
  MRIStepCoupling_Space(step_mem->MRIC, &Tliw, &Tlrw);
  MRIStepCoupling_Free(step_mem->MRIC);
  step_mem->MRIC = NULL;
  ark_mem->liw -= Tliw;
  ark_mem->lrw -= Tlrw;

  return(ARK_SUCCESS);
}